

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O2

Expression __thiscall
dynet::SimpleRNNBuilder::add_auxiliary_input(SimpleRNNBuilder *this,Expression *in,Expression *aux)

{
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *this_00;
  pointer pvVar1;
  pointer pvVar2;
  undefined8 *puVar3;
  pointer pEVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar7;
  long lVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  uint i;
  ulong uVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  initializer_list<dynet::Expression> local_f8;
  Expression local_e8;
  Expression x;
  _Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> local_a8;
  undefined8 uStack_90;
  ComputationGraph *local_88;
  VariableIndex VStack_80;
  uint uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  ComputationGraph *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = &this->h;
  pvVar1 = (this->h).
           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->h).
           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&local_a8,
             (ulong)this->layers,(allocator_type *)&x);
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)this_00,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&local_a8);
  uVar5 = ((long)pvVar2 - (long)pvVar1) / 0x18;
  std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base(&local_a8)
  ;
  x.pg = in->pg;
  x.i = in->i;
  x.graph_id = in->graph_id;
  uVar6 = uVar5 & 0xffffffff;
  lVar11 = 0;
  lVar10 = 0;
  for (uVar12 = 0; uVar12 < this->layers; uVar12 = uVar12 + 1) {
    pvVar1 = (this->param_vars).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar6 == 0) {
      pEVar4 = (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
          _M_impl.super__Vector_impl_data._M_finish == pEVar4) {
        lVar8 = *(long *)((long)&(pvVar1->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar10);
        local_a8._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar8 + 0x20);
        local_a8._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar8 + 0x28);
        puVar3 = *(undefined8 **)
                  ((long)&(pvVar1->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data + lVar10);
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
        uStack_90 = puVar3[1];
        lVar8 = *(long *)((long)&(pvVar1->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar10);
        local_78 = *(undefined8 *)(lVar8 + 0x30);
        uStack_70 = *(undefined8 *)(lVar8 + 0x38);
        local_68 = aux->pg;
        uStack_60._0_4_ = aux->i;
        uStack_60._4_4_ = aux->graph_id;
        local_f8._M_len = 5;
      }
      else {
        lVar8 = *(long *)((long)&(pvVar1->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar10);
        local_a8._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar8 + 0x20);
        local_a8._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar8 + 0x28);
        puVar3 = *(undefined8 **)
                  ((long)&(pvVar1->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data + lVar10);
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
        uStack_90 = puVar3[1];
        lVar8 = *(long *)((long)&(pvVar1->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar10);
        local_78 = *(undefined8 *)(lVar8 + 0x30);
        uStack_70 = *(undefined8 *)(lVar8 + 0x38);
        local_68 = aux->pg;
        uStack_60._0_4_ = aux->i;
        uStack_60._4_4_ = aux->graph_id;
        lVar8 = *(long *)((long)&(pvVar1->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar10);
        local_58 = *(undefined8 *)(lVar8 + 0x10);
        uStack_50 = *(undefined8 *)(lVar8 + 0x18);
        puVar3 = (undefined8 *)((long)&pEVar4->pg + lVar11);
        local_48 = *puVar3;
        uStack_40 = puVar3[1];
        local_f8._M_len = 7;
      }
      local_f8._M_array = (iterator)&local_a8;
      VStack_80 = x.i;
      uStack_7c = x.graph_id;
      local_88 = x.pg;
      local_e8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                           (&local_f8);
      tanh((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      lVar8 = *(long *)&(((this_00->
                          super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                        _M_impl;
      uVar7 = extraout_RAX_00;
      uVar9 = extraout_RDX_00;
    }
    else {
      lVar8 = *(long *)((long)&(pvVar1->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar10);
      local_a8._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar8 + 0x20);
      local_a8._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar8 + 0x28);
      puVar3 = *(undefined8 **)
                ((long)&(pvVar1->
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                        _M_impl.super__Vector_impl_data + lVar10);
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
      uStack_90 = puVar3[1];
      local_88 = x.pg;
      VStack_80 = x.i;
      uStack_7c = x.graph_id;
      lVar8 = *(long *)((long)&(pvVar1->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar10);
      local_78 = *(undefined8 *)(lVar8 + 0x30);
      uStack_70 = *(undefined8 *)(lVar8 + 0x38);
      local_68 = aux->pg;
      uStack_60._0_4_ = aux->i;
      uStack_60._4_4_ = aux->graph_id;
      lVar8 = *(long *)((long)&(pvVar1->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar10);
      local_58 = *(undefined8 *)(lVar8 + 0x10);
      uStack_50 = *(undefined8 *)(lVar8 + 0x18);
      puVar3 = (undefined8 *)
               (*(long *)&(this_00->
                          super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[(int)uVar5 - 1].
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl + lVar11);
      local_48 = *puVar3;
      uStack_40 = puVar3[1];
      local_f8._M_array = (iterator)&local_a8;
      local_f8._M_len = 7;
      local_e8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                           (&local_f8);
      tanh((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      lVar8 = *(long *)&(this_00->
                        super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar6].
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                        _M_impl;
      uVar7 = extraout_RAX;
      uVar9 = extraout_RDX;
    }
    *(undefined8 *)(lVar8 + lVar11) = uVar7;
    *(undefined8 *)(lVar8 + 8 + lVar11) = uVar9;
    x.pg = *(ComputationGraph **)(lVar8 + lVar11);
    x._8_8_ = ((undefined8 *)(lVar8 + lVar11))[1];
    lVar10 = lVar10 + 0x18;
    lVar11 = lVar11 + 0x10;
  }
  return (*(pointer *)
           ((long)&(this_00->
                   super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar6].
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
           + 8))[-1];
}

Assistant:

Expression SimpleRNNBuilder::add_auxiliary_input(const Expression &in, const Expression &aux) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    DYNET_ASSERT(vars.size() >= L2H + 1, "Failed dimension check in SimpleRNNBuilder");

    if(t > 0) {
      x = h[t][i] = tanh( affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux, vars[H2H], h[t-1][i]}) );
    } else if(h0.size() > 0) {
      x = h[t][i] = tanh( affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux, vars[H2H], h0[i]}) );
    } else {
      x = h[t][i] = tanh( affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux}) );
    }

  }
  return h[t].back();
}